

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

lzma_ret lzma_code(lzma_stream *strm,lzma_action action)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  lzma_internal *plVar3;
  lzma_code_function p_Var4;
  lzma_ret lVar5;
  uint uVar6;
  anon_enum_32 aVar7;
  size_t sVar8;
  size_t out_pos;
  size_t in_pos;
  
  puVar1 = strm->next_in;
  if ((puVar1 == (uint8_t *)0x0) && (strm->avail_in != 0)) {
    return LZMA_PROG_ERROR;
  }
  puVar2 = strm->next_out;
  if ((puVar2 == (uint8_t *)0x0) && (strm->avail_out != 0)) {
    return LZMA_PROG_ERROR;
  }
  plVar3 = strm->internal;
  if (plVar3 == (lzma_internal *)0x0) {
    return LZMA_PROG_ERROR;
  }
  p_Var4 = (plVar3->next).code;
  if (LZMA_FULL_BARRIER < action || p_Var4 == (lzma_code_function)0x0) {
    return LZMA_PROG_ERROR;
  }
  if (plVar3->supported_actions[action] != true) {
    return LZMA_PROG_ERROR;
  }
  if (strm->reserved_ptr1 != (void *)0x0) {
    return LZMA_OPTIONS_ERROR;
  }
  if (strm->reserved_ptr2 != (void *)0x0) {
    return LZMA_OPTIONS_ERROR;
  }
  if (strm->reserved_ptr3 != (void *)0x0) {
    return LZMA_OPTIONS_ERROR;
  }
  if (strm->reserved_ptr4 != (void *)0x0) {
    return LZMA_OPTIONS_ERROR;
  }
  if (strm->reserved_int1 != 0) {
    return LZMA_OPTIONS_ERROR;
  }
  if (strm->reserved_int2 != 0) {
    return LZMA_OPTIONS_ERROR;
  }
  if (strm->reserved_int3 != 0) {
    return LZMA_OPTIONS_ERROR;
  }
  if (strm->reserved_int4 != 0) {
    return LZMA_OPTIONS_ERROR;
  }
  if (strm->reserved_enum1 != LZMA_RESERVED_ENUM) {
    return LZMA_OPTIONS_ERROR;
  }
  if (strm->reserved_enum2 != LZMA_RESERVED_ENUM) {
    return LZMA_OPTIONS_ERROR;
  }
  switch(plVar3->sequence) {
  case ISEQ_RUN:
    if (action - LZMA_SYNC_FLUSH < 4) {
      plVar3->sequence = action;
    }
    goto LAB_0018da99;
  case ISEQ_SYNC_FLUSH:
    if (action != LZMA_SYNC_FLUSH) {
      return LZMA_PROG_ERROR;
    }
    break;
  case ISEQ_FULL_FLUSH:
    if (action != LZMA_FULL_FLUSH) {
      return LZMA_PROG_ERROR;
    }
    break;
  case ISEQ_FINISH:
    if (action != LZMA_FINISH) {
      return LZMA_PROG_ERROR;
    }
    break;
  case ISEQ_FULL_BARRIER:
    if (action != LZMA_FULL_BARRIER) {
      return LZMA_PROG_ERROR;
    }
    break;
  case ISEQ_END:
    return LZMA_STREAM_END;
  default:
    return LZMA_PROG_ERROR;
  }
  if (plVar3->avail_in != strm->avail_in) {
    return LZMA_PROG_ERROR;
  }
LAB_0018da99:
  in_pos = 0;
  out_pos = 0;
  lVar5 = (*p_Var4)((plVar3->next).coder,strm->allocator,puVar1,&in_pos,strm->avail_in,puVar2,
                    &out_pos,strm->avail_out,action);
  strm->next_in = strm->next_in + in_pos;
  plVar3 = strm->internal;
  sVar8 = strm->avail_in - in_pos;
  strm->avail_in = sVar8;
  strm->total_in = strm->total_in + in_pos;
  strm->next_out = strm->next_out + out_pos;
  strm->avail_out = strm->avail_out - out_pos;
  strm->total_out = strm->total_out + out_pos;
  plVar3->avail_in = sVar8;
  switch(lVar5) {
  case LZMA_OK:
    if (out_pos == 0 && in_pos == 0) {
      if (plVar3->allow_buf_error != false) {
        return LZMA_BUF_ERROR;
      }
      plVar3->allow_buf_error = true;
    }
    else {
LAB_0018db3d:
      plVar3->allow_buf_error = false;
    }
    lVar5 = LZMA_OK;
    break;
  case LZMA_STREAM_END:
    uVar6 = plVar3->sequence - ISEQ_SYNC_FLUSH;
    if (uVar6 < 4) {
      aVar7 = *(anon_enum_32 *)(&DAT_0023f5bc + (ulong)uVar6 * 4);
    }
    else {
      aVar7 = ISEQ_END;
    }
    plVar3->sequence = aVar7;
  case LZMA_NO_CHECK:
  case LZMA_UNSUPPORTED_CHECK:
  case LZMA_GET_CHECK:
  case LZMA_MEMLIMIT_ERROR:
    plVar3->allow_buf_error = false;
    break;
  case LZMA_BUF_ERROR:
    __assert_fail("ret != LZMA_BUF_ERROR",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/common.c"
                  ,0x15b,"lzma_ret lzma_code(lzma_stream *, lzma_action)");
  default:
    if (lVar5 == 0x20) goto LAB_0018db3d;
  case LZMA_MEM_ERROR:
  case LZMA_FORMAT_ERROR:
  case LZMA_OPTIONS_ERROR:
  case LZMA_DATA_ERROR:
    plVar3->sequence = ISEQ_ERROR;
  }
  return lVar5;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_code(lzma_stream *strm, lzma_action action)
{
	// Sanity checks
	if ((strm->next_in == NULL && strm->avail_in != 0)
			|| (strm->next_out == NULL && strm->avail_out != 0)
			|| strm->internal == NULL
			|| strm->internal->next.code == NULL
			|| (unsigned int)(action) > LZMA_ACTION_MAX
			|| !strm->internal->supported_actions[action])
		return LZMA_PROG_ERROR;

	// Check if unsupported members have been set to non-zero or non-NULL,
	// which would indicate that some new feature is wanted.
	if (strm->reserved_ptr1 != NULL
			|| strm->reserved_ptr2 != NULL
			|| strm->reserved_ptr3 != NULL
			|| strm->reserved_ptr4 != NULL
			|| strm->reserved_int1 != 0
			|| strm->reserved_int2 != 0
			|| strm->reserved_int3 != 0
			|| strm->reserved_int4 != 0
			|| strm->reserved_enum1 != LZMA_RESERVED_ENUM
			|| strm->reserved_enum2 != LZMA_RESERVED_ENUM)
		return LZMA_OPTIONS_ERROR;

	switch (strm->internal->sequence) {
	case ISEQ_RUN:
		switch (action) {
		case LZMA_RUN:
			break;

		case LZMA_SYNC_FLUSH:
			strm->internal->sequence = ISEQ_SYNC_FLUSH;
			break;

		case LZMA_FULL_FLUSH:
			strm->internal->sequence = ISEQ_FULL_FLUSH;
			break;

		case LZMA_FINISH:
			strm->internal->sequence = ISEQ_FINISH;
			break;

		case LZMA_FULL_BARRIER:
			strm->internal->sequence = ISEQ_FULL_BARRIER;
			break;
		}

		break;

	case ISEQ_SYNC_FLUSH:
		// The same action must be used until we return
		// LZMA_STREAM_END, and the amount of input must not change.
		if (action != LZMA_SYNC_FLUSH
				|| strm->internal->avail_in != strm->avail_in)
			return LZMA_PROG_ERROR;

		break;

	case ISEQ_FULL_FLUSH:
		if (action != LZMA_FULL_FLUSH
				|| strm->internal->avail_in != strm->avail_in)
			return LZMA_PROG_ERROR;

		break;

	case ISEQ_FINISH:
		if (action != LZMA_FINISH
				|| strm->internal->avail_in != strm->avail_in)
			return LZMA_PROG_ERROR;

		break;

	case ISEQ_FULL_BARRIER:
		if (action != LZMA_FULL_BARRIER
				|| strm->internal->avail_in != strm->avail_in)
			return LZMA_PROG_ERROR;

		break;

	case ISEQ_END:
		return LZMA_STREAM_END;

	case ISEQ_ERROR:
	default:
		return LZMA_PROG_ERROR;
	}

	size_t in_pos = 0;
	size_t out_pos = 0;
	lzma_ret ret = strm->internal->next.code(
			strm->internal->next.coder, strm->allocator,
			strm->next_in, &in_pos, strm->avail_in,
			strm->next_out, &out_pos, strm->avail_out, action);

	strm->next_in += in_pos;
	strm->avail_in -= in_pos;
	strm->total_in += in_pos;

	strm->next_out += out_pos;
	strm->avail_out -= out_pos;
	strm->total_out += out_pos;

	strm->internal->avail_in = strm->avail_in;

	// Cast is needed to silence a warning about LZMA_TIMED_OUT, which
	// isn't part of lzma_ret enumeration.
	switch ((unsigned int)(ret)) {
	case LZMA_OK:
		// Don't return LZMA_BUF_ERROR when it happens the first time.
		// This is to avoid returning LZMA_BUF_ERROR when avail_out
		// was zero but still there was no more data left to written
		// to next_out.
		if (out_pos == 0 && in_pos == 0) {
			if (strm->internal->allow_buf_error)
				ret = LZMA_BUF_ERROR;
			else
				strm->internal->allow_buf_error = true;
		} else {
			strm->internal->allow_buf_error = false;
		}
		break;

	case LZMA_TIMED_OUT:
		strm->internal->allow_buf_error = false;
		ret = LZMA_OK;
		break;

	case LZMA_STREAM_END:
		if (strm->internal->sequence == ISEQ_SYNC_FLUSH
				|| strm->internal->sequence == ISEQ_FULL_FLUSH
				|| strm->internal->sequence
					== ISEQ_FULL_BARRIER)
			strm->internal->sequence = ISEQ_RUN;
		else
			strm->internal->sequence = ISEQ_END;

	// Fall through

	case LZMA_NO_CHECK:
	case LZMA_UNSUPPORTED_CHECK:
	case LZMA_GET_CHECK:
	case LZMA_MEMLIMIT_ERROR:
		// Something else than LZMA_OK, but not a fatal error,
		// that is, coding may be continued (except if ISEQ_END).
		strm->internal->allow_buf_error = false;
		break;

	default:
		// All the other errors are fatal; coding cannot be continued.
		assert(ret != LZMA_BUF_ERROR);
		strm->internal->sequence = ISEQ_ERROR;
		break;
	}

	return ret;
}